

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_micro.c
# Opt level: O1

void * worker_thread_put(void *arg)

{
  int iVar1;
  void *extraout_RAX;
  undefined4 extraout_var;
  long lVar2;
  void *extraout_RDX;
  os_thread_t *thread;
  uint uVar3;
  ulong uVar5;
  ulong uVar6;
  void *pvVar7;
  os_thread_t *thread_00;
  double dVar8;
  undefined1 local_58 [8];
  benchmark_time_t t2;
  benchmark_time_t tdiff;
  benchmark_time_t t1;
  undefined8 uVar4;
  
  uVar6 = (ulong)(uint)(*(int *)((long)arg + 0x1c) * *arg);
  benchmark_time_get((benchmark_time_t *)&tdiff.tv_nsec);
  t1.tv_nsec = uVar6;
  if (*(int *)((long)arg + 0x1c) != 0) {
    do {
      uVar4 = *(undefined8 *)((long)arg + 8);
      lVar2 = ((ulong)t1.tv_nsec % (ulong)*(uint *)((long)arg + 0x18)) * 0x10;
      thread = (os_thread_t *)&t1.tv_nsec;
      iVar1 = vmemcache_put(uVar4,&t1.tv_nsec,8,
                            *(undefined8 *)(*(long *)((long)arg + 0x10) + 8 + lVar2),
                            *(undefined8 *)(*(long *)((long)arg + 0x10) + lVar2));
      uVar3 = (uint)uVar4;
      if (iVar1 != 0) {
        worker_thread_put_cold_1();
        pvVar7 = extraout_RAX;
        if (uVar3 != 0) {
          uVar5 = (ulong)uVar3;
          uVar6 = uVar5;
          pvVar7 = extraout_RDX;
          thread_00 = thread;
          do {
            os_thread_create(thread_00,(os_thread_attr_t *)0x0,
                             *(_func_void_ptr_void_ptr **)((long)pvVar7 + 0x28),pvVar7);
            thread_00 = thread_00 + 1;
            pvVar7 = (void *)((long)pvVar7 + 0x30);
            uVar6 = uVar6 - 1;
          } while (uVar6 != 0);
          do {
            iVar1 = os_thread_join(thread,(void **)0x0);
            pvVar7 = (void *)CONCAT44(extraout_var,iVar1);
            thread = thread + 1;
            uVar5 = uVar5 - 1;
          } while (uVar5 != 0);
        }
        return pvVar7;
      }
      t1.tv_nsec = t1.tv_nsec + 1;
    } while ((ulong)t1.tv_nsec < *(uint *)((long)arg + 0x1c) + uVar6);
  }
  benchmark_time_get((benchmark_time_t *)local_58);
  benchmark_time_diff((benchmark_time_t *)&t2.tv_nsec,(benchmark_time_t *)&tdiff.tv_nsec,
                      (benchmark_time_t *)local_58);
  dVar8 = benchmark_time_get_secs((benchmark_time_t *)&t2.tv_nsec);
  *(double *)((long)arg + 0x20) = dVar8;
  return (void *)0x0;
}

Assistant:

static void *
worker_thread_put(void *arg)
{
	struct context *ctx = arg;
	unsigned long long i;
	unsigned long long shift = ctx->thread_number * ctx->ops_count;
	benchmark_time_t t1, t2, tdiff;

	benchmark_time_get(&t1);

	for (i = shift; i < (shift + ctx->ops_count); i++) {
		if (vmemcache_put(ctx->cache, &i, sizeof(i),
				ctx->buffs[i % ctx->nbuffs].buff,
				ctx->buffs[i % ctx->nbuffs].size))
			UT_FATAL("ERROR: vmemcache_put: %s",
					vmemcache_errormsg());
	}

	benchmark_time_get(&t2);
	benchmark_time_diff(&tdiff, &t1, &t2);
	ctx->secs = benchmark_time_get_secs(&tdiff);

	return NULL;
}